

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audio.cpp
# Opt level: O3

void __thiscall
Apple::Macintosh::Audio::apply_samples<(Outputs::Speaker::Action)0>
          (Audio *this,size_t number_of_samples,MonoSample *target)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  short sVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar16;
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  int iVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar34;
  int iVar36;
  undefined1 auVar35 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar39 [16];
  
  auVar8 = _DAT_004abf20;
  auVar7 = _DAT_004abf10;
  auVar6 = _DAT_00463a50;
  auVar5 = _DAT_00463a40;
  auVar4 = _DAT_00463a30;
  if (number_of_samples != 0) {
    sVar10 = (this->sample_queue_).read_pointer;
    sVar11 = this->subcycle_offset_;
    do {
      uVar14 = -(sVar11 - 0xb0);
      if (number_of_samples <= -(sVar11 - 0xb0)) {
        uVar14 = number_of_samples;
      }
      if (sVar11 != 0xb0) {
        sVar9 = ((this->sample_queue_).buffer._M_elems[sVar10].super___atomic_base<unsigned_char>.
                 _M_i - 0x80) * this->volume_multiplier_;
        uVar12 = uVar14 + 0x7fffffffffffffff & 0x7fffffffffffffff;
        auVar15._8_4_ = (int)uVar12;
        auVar15._0_8_ = uVar12;
        auVar15._12_4_ = (int)(uVar12 >> 0x20);
        auVar15 = auVar15 ^ auVar6;
        lVar13 = 0;
        do {
          auVar27._8_4_ = (int)lVar13;
          auVar27._0_8_ = lVar13;
          auVar27._12_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar19 = (auVar27 | auVar5) ^ auVar6;
          iVar28 = auVar15._0_4_;
          iVar34 = -(uint)(iVar28 < auVar19._0_4_);
          iVar16 = auVar15._4_4_;
          auVar20._4_4_ = -(uint)(iVar16 < auVar19._4_4_);
          iVar33 = auVar15._8_4_;
          iVar36 = -(uint)(iVar33 < auVar19._8_4_);
          iVar17 = auVar15._12_4_;
          auVar20._12_4_ = -(uint)(iVar17 < auVar19._12_4_);
          auVar30._4_4_ = iVar34;
          auVar30._0_4_ = iVar34;
          auVar30._8_4_ = iVar36;
          auVar30._12_4_ = iVar36;
          auVar37 = pshuflw(in_XMM11,auVar30,0xe8);
          auVar22._4_4_ = -(uint)(auVar19._4_4_ == iVar16);
          auVar22._12_4_ = -(uint)(auVar19._12_4_ == iVar17);
          auVar22._0_4_ = auVar22._4_4_;
          auVar22._8_4_ = auVar22._12_4_;
          auVar39 = pshuflw(in_XMM12,auVar22,0xe8);
          auVar20._0_4_ = auVar20._4_4_;
          auVar20._8_4_ = auVar20._12_4_;
          auVar38 = pshuflw(auVar37,auVar20,0xe8);
          auVar19._8_4_ = 0xffffffff;
          auVar19._0_8_ = 0xffffffffffffffff;
          auVar19._12_4_ = 0xffffffff;
          auVar19 = (auVar38 | auVar39 & auVar37) ^ auVar19;
          auVar19 = packssdw(auVar19,auVar19);
          if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            target[lVar13] = sVar9;
          }
          auVar20 = auVar22 & auVar30 | auVar20;
          auVar19 = packssdw(auVar20,auVar20);
          auVar38._8_4_ = 0xffffffff;
          auVar38._0_8_ = 0xffffffffffffffff;
          auVar38._12_4_ = 0xffffffff;
          auVar19 = packssdw(auVar19 ^ auVar38,auVar19 ^ auVar38);
          if ((auVar19._0_4_ >> 0x10 & 1) != 0) {
            target[lVar13 + 1] = sVar9;
          }
          auVar19 = (auVar27 | auVar4) ^ auVar6;
          iVar34 = -(uint)(iVar28 < auVar19._0_4_);
          auVar35._4_4_ = -(uint)(iVar16 < auVar19._4_4_);
          iVar36 = -(uint)(iVar33 < auVar19._8_4_);
          auVar35._12_4_ = -(uint)(iVar17 < auVar19._12_4_);
          auVar21._4_4_ = iVar34;
          auVar21._0_4_ = iVar34;
          auVar21._8_4_ = iVar36;
          auVar21._12_4_ = iVar36;
          auVar29._4_4_ = -(uint)(auVar19._4_4_ == iVar16);
          auVar29._12_4_ = -(uint)(auVar19._12_4_ == iVar17);
          auVar29._0_4_ = auVar29._4_4_;
          auVar29._8_4_ = auVar29._12_4_;
          auVar35._0_4_ = auVar35._4_4_;
          auVar35._8_4_ = auVar35._12_4_;
          auVar19 = auVar29 & auVar21 | auVar35;
          auVar19 = packssdw(auVar19,auVar19);
          auVar1._8_4_ = 0xffffffff;
          auVar1._0_8_ = 0xffffffffffffffff;
          auVar1._12_4_ = 0xffffffff;
          auVar19 = packssdw(auVar19 ^ auVar1,auVar19 ^ auVar1);
          if ((auVar19 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            target[lVar13 + 2] = sVar9;
          }
          auVar22 = pshufhw(auVar21,auVar21,0x84);
          auVar30 = pshufhw(auVar29,auVar29,0x84);
          auVar20 = pshufhw(auVar22,auVar35,0x84);
          auVar23._8_4_ = 0xffffffff;
          auVar23._0_8_ = 0xffffffffffffffff;
          auVar23._12_4_ = 0xffffffff;
          auVar23 = (auVar20 | auVar30 & auVar22) ^ auVar23;
          auVar22 = packssdw(auVar23,auVar23);
          if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            target[lVar13 + 3] = sVar9;
          }
          auVar22 = (auVar27 | auVar8) ^ auVar6;
          iVar34 = -(uint)(iVar28 < auVar22._0_4_);
          auVar25._4_4_ = -(uint)(iVar16 < auVar22._4_4_);
          iVar36 = -(uint)(iVar33 < auVar22._8_4_);
          auVar25._12_4_ = -(uint)(iVar17 < auVar22._12_4_);
          auVar31._4_4_ = iVar34;
          auVar31._0_4_ = iVar34;
          auVar31._8_4_ = iVar36;
          auVar31._12_4_ = iVar36;
          auVar19 = pshuflw(auVar19,auVar31,0xe8);
          auVar24._4_4_ = -(uint)(auVar22._4_4_ == iVar16);
          auVar24._12_4_ = -(uint)(auVar22._12_4_ == iVar17);
          auVar24._0_4_ = auVar24._4_4_;
          auVar24._8_4_ = auVar24._12_4_;
          auVar22 = pshuflw(auVar39 & auVar37,auVar24,0xe8);
          in_XMM12 = auVar22 & auVar19;
          auVar25._0_4_ = auVar25._4_4_;
          auVar25._8_4_ = auVar25._12_4_;
          auVar19 = pshuflw(auVar19,auVar25,0xe8);
          auVar37._8_4_ = 0xffffffff;
          auVar37._0_8_ = 0xffffffffffffffff;
          auVar37._12_4_ = 0xffffffff;
          auVar37 = (auVar19 | in_XMM12) ^ auVar37;
          in_XMM11 = packssdw(auVar37,auVar37);
          if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            target[lVar13 + 4] = sVar9;
          }
          auVar25 = auVar24 & auVar31 | auVar25;
          auVar19 = packssdw(auVar25,auVar25);
          auVar39._8_4_ = 0xffffffff;
          auVar39._0_8_ = 0xffffffffffffffff;
          auVar39._12_4_ = 0xffffffff;
          auVar19 = packssdw(auVar19 ^ auVar39,auVar19 ^ auVar39);
          if ((auVar19 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            target[lVar13 + 5] = sVar9;
          }
          auVar19 = (auVar27 | auVar7) ^ auVar6;
          iVar28 = -(uint)(iVar28 < auVar19._0_4_);
          auVar32._4_4_ = -(uint)(iVar16 < auVar19._4_4_);
          iVar33 = -(uint)(iVar33 < auVar19._8_4_);
          auVar32._12_4_ = -(uint)(iVar17 < auVar19._12_4_);
          auVar26._4_4_ = iVar28;
          auVar26._0_4_ = iVar28;
          auVar26._8_4_ = iVar33;
          auVar26._12_4_ = iVar33;
          auVar18._4_4_ = -(uint)(auVar19._4_4_ == iVar16);
          auVar18._12_4_ = -(uint)(auVar19._12_4_ == iVar17);
          auVar18._0_4_ = auVar18._4_4_;
          auVar18._8_4_ = auVar18._12_4_;
          auVar32._0_4_ = auVar32._4_4_;
          auVar32._8_4_ = auVar32._12_4_;
          auVar19 = auVar18 & auVar26 | auVar32;
          auVar19 = packssdw(auVar19,auVar19);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar19 = packssdw(auVar19 ^ auVar2,auVar19 ^ auVar2);
          if ((auVar19 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            target[lVar13 + 6] = sVar9;
          }
          auVar27 = pshufhw(auVar26,auVar26,0x84);
          auVar19 = pshufhw(auVar18,auVar18,0x84);
          auVar22 = pshufhw(auVar27,auVar32,0x84);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar19 = packssdw(auVar19 & auVar27,(auVar22 | auVar19 & auVar27) ^ auVar3);
          if ((auVar19 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            target[lVar13 + 7] = sVar9;
          }
          lVar13 = lVar13 + 8;
        } while ((uVar12 - ((uint)(uVar14 + 0x7fffffffffffffff) & 7)) + 8 != lVar13);
      }
      target = target + uVar14;
      sVar10 = (sVar10 + (sVar11 + uVar14) / 0xb0) % 0x2e4;
      (this->sample_queue_).read_pointer = sVar10;
      sVar11 = (sVar11 + uVar14) % 0xb0;
      this->subcycle_offset_ = sVar11;
      number_of_samples = number_of_samples - uVar14;
    } while (number_of_samples != 0);
  }
  return;
}

Assistant:

void Audio::apply_samples(std::size_t number_of_samples, Outputs::Speaker::MonoSample *target) {
	// TODO: the implementation below acts as if the hardware uses pulse-amplitude modulation;
	// in fact it uses pulse-width modulation. But the scale for pulses isn't specified, so
	// that's something to return to.

	while(number_of_samples) {
		// Determine how many output samples will be at the same level.
		const auto cycles_left_in_sample = std::min(number_of_samples, sample_length - subcycle_offset_);

		// Determine the output level, and output that many samples.
		const int16_t output_level = volume_multiplier_ * (int16_t(sample_queue_.buffer[sample_queue_.read_pointer].load(std::memory_order::memory_order_relaxed)) - 128);
		Outputs::Speaker::fill<action>(target, target + cycles_left_in_sample, output_level);
		target += cycles_left_in_sample;

		// Advance the sample pointer.
		subcycle_offset_ += cycles_left_in_sample;
		sample_queue_.read_pointer = (sample_queue_.read_pointer + (subcycle_offset_ / sample_length)) % sample_queue_.buffer.size();
		subcycle_offset_ %= sample_length;

		// Decreate the number of samples left to write.
		number_of_samples -= cycles_left_in_sample;
	}
}